

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

void yyrestart(FILE *input_file)

{
  YY_BUFFER_STATE pyVar1;
  FILE *in_stack_00000008;
  int in_stack_ffffffffffffffec;
  FILE *in_stack_fffffffffffffff0;
  
  if ((yy_buffer_stack == (YY_BUFFER_STATE *)0x0) ||
     (yy_buffer_stack[yy_buffer_stack_top] == (YY_BUFFER_STATE)0x0)) {
    yyensure_buffer_stack();
    pyVar1 = yy_create_buffer(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
    yy_buffer_stack[yy_buffer_stack_top] = pyVar1;
  }
  yy_init_buffer((YY_BUFFER_STATE)input_file,in_stack_00000008);
  yy_load_buffer_state();
  return;
}

Assistant:

void yyrestart  (FILE * input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}